

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::updateVerify(HDual *this)

{
  double *pdVar1;
  long in_RDI;
  double dVar2;
  double aDiff;
  double aRow;
  double aCol;
  double local_18;
  double local_10 [2];
  
  if (*(int *)(in_RDI + 0x15c) == 0) {
    local_10[0] = ABS(*(double *)(in_RDI + 0x6e8));
    local_18 = ABS(*(double *)(in_RDI + 0x6f0));
    dVar2 = local_10[0] - local_18;
    pdVar1 = std::min<double>(local_10,&local_18);
    if ((1e-07 < ABS(dVar2) / *pdVar1) && (0 < *(int *)(*(long *)(in_RDI + 0x60) + 0x584))) {
      *(undefined4 *)(in_RDI + 0x15c) = 6;
    }
  }
  return;
}

Assistant:

void HDual::updateVerify() {
	if (invertHint)
		return;

	// The alpha
	double aCol = fabs(alpha);
	double aRow = fabs(alphaRow);
	double aDiff = fabs(aCol - aRow);
	if (aDiff / min(aCol, aRow) > 1e-7 && model->countUpdate > 0) {
	  invertHint = invertHint_possiblySingularBasis; // Was 1
	}

	// We get this thing, but it is not actived by default.
//    // The dual reduced cost
//    double dualin_u = workDual[columnIn];
//    double dualin_c = model->getWorkCost()[columnIn];
//    for (int i = 0; i < column.count; i++) {
//        int iRow = column.index[i];
//        int iCol = model->getBaseIndex()[iRow];
//        double value = column.array[iRow];
//        double cost = model->getWorkCost()[iCol] + model->getWorkShift()[iCol];
//        dualin_c -= cost * value;
//    }
//    double dualin_diff = fabs(dualin_c - dualin_u);
////    if (dualin_diff > Td) {
////        cout << dualin_c << "\t" << dualin_u << "\t" << dualin_diff << endl;
////        invertHint = invertHint_possiblySingularBasis; // Was 1
////    }
}